

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeoffsets_tests.cpp
# Opt level: O1

void __thiscall timeoffsets_tests::timeoffsets_warning::test_method(timeoffsets_warning *this)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  readonly_property<bool> rVar4;
  bool bVar5;
  void *pvVar6;
  long lVar7;
  iterator in_R8;
  iterator pvVar8;
  iterator in_R9;
  iterator pvVar9;
  long in_FS_OFFSET;
  undefined1 auVar10 [16];
  const_string file;
  initializer_list<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> __l;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  check_type cVar11;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  assertion_result local_e8;
  char **local_d0;
  allocator_type local_c1;
  vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  local_c0;
  assertion_result local_a8;
  undefined1 *local_88;
  undefined1 *local_80;
  char *local_78;
  char *local_70;
  lazy_ostream local_68;
  undefined1 *local_58;
  vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  *pvStack_50;
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/timeoffsets_tests.cpp"
  ;
  local_70 = "";
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x40;
  file.m_begin = (iterator)&local_78;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_88,msg);
  local_58 = (undefined1 *)0xfffffffffffff8f8;
  pvStack_50 = (vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                *)0x0;
  local_68._vptr_lazy_ostream = (_func_int **)0xfffffffffffff1f0;
  local_68._8_8_ = 0xfffffffffffff6a0;
  local_48 = 600;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_68;
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::vector(&local_c0,__l,&local_c1);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)IsWarningRaised(&local_c0);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0 = &local_f8;
  local_f8 = "IsWarningRaised({{-60min, -40min, -30min, 0min, 10min}})";
  local_f0 = "";
  local_e8.m_message.px = (element_type *)(local_e8.m_message._1_8_ << 8);
  local_e8._0_8_ = &PTR__lazy_ostream_013abc70;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/timeoffsets_tests.cpp"
  ;
  local_100 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,(lazy_ostream *)&local_e8,1,0,WARN,_cVar11,(size_t)&local_108,0x40);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  if (local_c0.
      super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.
                    super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.
                          super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.
                          super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/timeoffsets_tests.cpp"
  ;
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x41;
  file_00.m_begin = (iterator)&local_118;
  msg_00.m_end = pvVar9;
  msg_00.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_128,
             msg_00);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_a8._1_7_ = 0;
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  pvVar6 = operator_new(0x28);
  auVar3 = _DAT_00e6c2d0;
  auVar2 = _DAT_00e6c2c0;
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       SUB81(pvVar6,0);
  local_a8._1_7_ = SUB87((ulong)pvVar6 >> 8,0);
  local_a8.m_message.px = (element_type *)((long)pvVar6 + 0x28);
  lVar7 = 0;
  do {
    auVar10._8_4_ = (int)lVar7;
    auVar10._0_8_ = lVar7;
    auVar10._12_4_ = (int)((ulong)lVar7 >> 0x20);
    auVar10 = (auVar10 | auVar2) ^ auVar3;
    if (auVar10._4_4_ == -0x80000000 && auVar10._0_4_ < -0x7ffffffb) {
      *(undefined8 *)((long)pvVar6 + lVar7 * 8) = 0x294;
      *(undefined8 *)((long)pvVar6 + lVar7 * 8 + 8) = 0x294;
    }
    lVar7 = lVar7 + 2;
  } while (lVar7 != 6);
  local_a8.m_message.pn.pi_ = (sp_counted_base *)local_a8.m_message.px;
  rVar4.super_class_property<bool>.value =
       (class_property<bool>)
       IsWarningRaised((vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                        *)&local_a8);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0.
  super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xf418e5;
  local_c0.
  super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xf41900;
  local_68._8_8_ = local_68._8_8_ & 0xffffffffffffff00;
  local_68._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_58 = boost::unit_test::lazy_ostream::inst;
  pvStack_50 = &local_c0;
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/timeoffsets_tests.cpp"
  ;
  local_130 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar4.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,&local_68,1,0,WARN,_cVar11,(size_t)&local_138,0x41);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  operator_delete(pvVar6,0x28);
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/timeoffsets_tests.cpp"
  ;
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x43;
  file_01.m_begin = (iterator)&local_148;
  msg_01.m_end = pvVar9;
  msg_01.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_158,
             msg_01);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_a8._1_7_ = 0;
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  pvVar6 = operator_new(0x20);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       SUB81(pvVar6,0);
  local_a8._1_7_ = SUB87((ulong)pvVar6 >> 8,0);
  local_a8.m_message.px = (element_type *)((long)pvVar6 + 0x20);
  lVar7 = 0;
  do {
    puVar1 = (undefined8 *)((long)pvVar6 + lVar7 * 8);
    *puVar1 = 0xe10;
    puVar1[1] = 0xe10;
    lVar7 = lVar7 + 2;
  } while (lVar7 != 4);
  local_a8.m_message.pn.pi_ = (sp_counted_base *)local_a8.m_message.px;
  bVar5 = IsWarningRaised((vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                           *)&local_a8);
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar5;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0.
  super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xf41901;
  local_c0.
  super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xf4191d;
  local_68._8_8_ = local_68._8_8_ & 0xffffffffffffff00;
  local_68._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_58 = boost::unit_test::lazy_ostream::inst;
  pvStack_50 = &local_c0;
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/timeoffsets_tests.cpp"
  ;
  local_160 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,&local_68,1,0,WARN,_cVar11,(size_t)&local_168,0x43);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  operator_delete(pvVar6,0x20);
  local_178 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/timeoffsets_tests.cpp"
  ;
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x44;
  file_02.m_begin = (iterator)&local_178;
  msg_02.m_end = pvVar9;
  msg_02.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_188,
             msg_02);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_a8._1_7_ = 0;
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  pvVar6 = operator_new(800);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       SUB81(pvVar6,0);
  local_a8._1_7_ = SUB87((ulong)pvVar6 >> 8,0);
  local_a8.m_message.px = (element_type *)((long)pvVar6 + 800);
  lVar7 = 0;
  do {
    puVar1 = (undefined8 *)((long)pvVar6 + lVar7 * 8);
    *puVar1 = 0xb4;
    puVar1[1] = 0xb4;
    lVar7 = lVar7 + 2;
  } while (lVar7 != 100);
  local_a8.m_message.pn.pi_ = (sp_counted_base *)local_a8.m_message.px;
  bVar5 = IsWarningRaised((vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                           *)&local_a8);
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar5;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0.
  super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xf4191e;
  local_c0.
  super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xf4193b;
  local_68._8_8_ = local_68._8_8_ & 0xffffffffffffff00;
  local_68._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_58 = boost::unit_test::lazy_ostream::inst;
  pvStack_50 = &local_c0;
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/timeoffsets_tests.cpp"
  ;
  local_190 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,&local_68,1,0,WARN,_cVar11,(size_t)&local_198,0x44);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  operator_delete(pvVar6,800);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(timeoffsets_warning)
{
    BOOST_CHECK(IsWarningRaised({{-60min, -40min, -30min, 0min, 10min}}));
    BOOST_CHECK(IsWarningRaised({5, 11min}));

    BOOST_CHECK(!IsWarningRaised({4, 60min}));
    BOOST_CHECK(!IsWarningRaised({100, 3min}));
}